

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

SUNErrCode N_VLinearCombination_Serial(int nvec,sunrealtype *c,N_Vector *X,N_Vector z)

{
  long lVar1;
  long lVar2;
  long *in_RCX;
  undefined8 *in_RDX;
  double *in_RSI;
  int in_EDI;
  sunrealtype *xd;
  sunrealtype *zd;
  sunindextype N;
  sunindextype j;
  int i;
  SUNContext sunctx_local_scope_;
  undefined4 in_stack_00000054;
  N_Vector in_stack_ffffffffffffffc0;
  N_Vector in_stack_ffffffffffffffc8;
  long lVar3;
  long lVar4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  
  if (in_EDI == 1) {
    N_VScale_Serial((sunrealtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else if (in_EDI == 2) {
    N_VLinearSum_Serial((sunrealtype)CONCAT44(in_stack_00000054,nvec),(N_Vector)c,(sunrealtype)X,z,
                        (N_Vector)sunctx_local_scope_);
  }
  else {
    lVar1 = *(long *)*in_RCX;
    lVar2 = *(long *)(*in_RCX + 0x10);
    if ((((long *)*in_RDX != in_RCX) || (*in_RSI != 1.0)) || (NAN(*in_RSI))) {
      if ((long *)*in_RDX == in_RCX) {
        for (lVar4 = 0; lVar4 < lVar1; lVar4 = lVar4 + 1) {
          *(double *)(lVar2 + lVar4 * 8) = *in_RSI * *(double *)(lVar2 + lVar4 * 8);
        }
        for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
          lVar4 = *(long *)(*(long *)in_RDX[iVar5] + 0x10);
          for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
            *(double *)(lVar2 + lVar3 * 8) =
                 in_RSI[iVar5] * *(double *)(lVar4 + lVar3 * 8) + *(double *)(lVar2 + lVar3 * 8);
          }
        }
      }
      else {
        lVar4 = *(long *)(*(long *)*in_RDX + 0x10);
        for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
          *(double *)(lVar2 + lVar3 * 8) = *in_RSI * *(double *)(lVar4 + lVar3 * 8);
        }
        for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
          lVar4 = *(long *)(*(long *)in_RDX[iVar5] + 0x10);
          for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
            *(double *)(lVar2 + lVar3 * 8) =
                 in_RSI[iVar5] * *(double *)(lVar4 + lVar3 * 8) + *(double *)(lVar2 + lVar3 * 8);
          }
        }
      }
    }
    else {
      for (iVar5 = 1; iVar5 < in_EDI; iVar5 = iVar5 + 1) {
        lVar4 = *(long *)(*(long *)in_RDX[iVar5] + 0x10);
        for (lVar3 = 0; lVar3 < lVar1; lVar3 = lVar3 + 1) {
          *(double *)(lVar2 + lVar3 * 8) =
               in_RSI[iVar5] * *(double *)(lVar4 + lVar3 * 8) + *(double *)(lVar2 + lVar3 * 8);
        }
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VLinearCombination_Serial(int nvec, sunrealtype* c, N_Vector* X,
                                       N_Vector z)
{
  SUNFunctionBegin(X[0]->sunctx);

  int i;
  sunindextype j, N;
  sunrealtype* zd = NULL;
  sunrealtype* xd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VScale */
  if (nvec == 1)
  {
    N_VScale_Serial(c[0], X[0], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* should have called N_VLinearSum */
  if (nvec == 2)
  {
    N_VLinearSum_Serial(c[0], X[0], c[1], X[1], z);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length and data array */
  N  = NV_LENGTH_S(z);
  zd = NV_DATA_S(z);

  /*
   * X[0] += c[i]*X[i], i = 1,...,nvec-1
   */
  if ((X[0] == z) && (c[0] == ONE))
  {
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * X[0] = c[0] * X[0] + sum{ c[i] * X[i] }, i = 1,...,nvec-1
   */
  if (X[0] == z)
  {
    for (j = 0; j < N; j++) { zd[j] *= c[0]; }
    for (i = 1; i < nvec; i++)
    {
      xd = NV_DATA_S(X[i]);
      for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
    }
    return SUN_SUCCESS;
  }

  /*
   * z = sum{ c[i] * X[i] }, i = 0,...,nvec-1
   */
  xd = NV_DATA_S(X[0]);
  for (j = 0; j < N; j++) { zd[j] = c[0] * xd[j]; }
  for (i = 1; i < nvec; i++)
  {
    xd = NV_DATA_S(X[i]);
    for (j = 0; j < N; j++) { zd[j] += c[i] * xd[j]; }
  }
  return SUN_SUCCESS;
}